

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcSurfaceStyleRendering::~IfcSurfaceStyleRendering
          (IfcSurfaceStyleRendering *this,void **vtt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  
  pp_Var2 = (_func_int **)*vtt;
  (this->super_IfcSurfaceStyleShading).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>._vptr_ObjectHelper =
       pp_Var2;
  *(void **)((long)&(this->super_IfcSurfaceStyleShading).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>.
                    _vptr_ObjectHelper + (long)pp_Var2[-3]) = vtt[7];
  *(void **)&(this->super_IfcSurfaceStyleShading).
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>.field_0x18 =
       vtt[8];
  pcVar3 = (this->ReflectanceMethod)._M_dataplus._M_p;
  paVar1 = &(this->ReflectanceMethod).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  p_Var4 = (this->SpecularHighlight).ptr.
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  p_Var4 = (this->SpecularColour).ptr.
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  p_Var4 = (this->ReflectionColour).ptr.
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  p_Var4 = (this->DiffuseTransmissionColour).ptr.
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  p_Var4 = (this->TransmissionColour).ptr.
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  p_Var4 = (this->DiffuseColour).ptr.
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    return;
  }
  return;
}

Assistant:

IfcSurfaceStyleRendering() : Object("IfcSurfaceStyleRendering") {}